

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch_amalgamated.cpp
# Opt level: O0

TestCaseProperties Catch::anon_unknown_26::parseSpecialTag(StringRef tag)

{
  bool bVar1;
  char cVar2;
  StringRef other;
  StringRef SVar3;
  undefined1 in_stack_ffffffffffffff98 [16];
  StringRef in_stack_ffffffffffffffa8;
  StringRef local_18;
  TestCaseProperties local_1;
  
  bVar1 = StringRef::empty(&local_18);
  if ((!bVar1) && (cVar2 = StringRef::operator[](&local_18,0), cVar2 == '.')) {
    return IsHidden;
  }
  operator____sr(in_stack_ffffffffffffff98._8_8_,in_stack_ffffffffffffff98._0_8_);
  bVar1 = StringRef::operator==(in_stack_ffffffffffffff98._8_8_,in_stack_ffffffffffffffa8);
  if (bVar1) {
    local_1 = Throws;
  }
  else {
    operator____sr(in_stack_ffffffffffffff98._8_8_,in_stack_ffffffffffffff98._0_8_);
    bVar1 = StringRef::operator==(in_stack_ffffffffffffff98._8_8_,in_stack_ffffffffffffffa8);
    if (bVar1) {
      local_1 = ShouldFail;
    }
    else {
      operator____sr(in_stack_ffffffffffffff98._8_8_,in_stack_ffffffffffffff98._0_8_);
      bVar1 = StringRef::operator==(in_stack_ffffffffffffff98._8_8_,in_stack_ffffffffffffffa8);
      if (bVar1) {
        local_1 = MayFail;
      }
      else {
        other = operator____sr(in_stack_ffffffffffffff98._8_8_,in_stack_ffffffffffffff98._0_8_);
        bVar1 = StringRef::operator==(in_stack_ffffffffffffff98._8_8_,other);
        if (bVar1) {
          local_1 = NonPortable;
        }
        else {
          SVar3 = operator____sr(in_stack_ffffffffffffff98._8_8_,in_stack_ffffffffffffff98._0_8_);
          bVar1 = StringRef::operator==((StringRef *)SVar3.m_size,other);
          if (bVar1) {
            local_1 = operator|(Benchmark,IsHidden);
          }
          else {
            local_1 = None;
          }
        }
      }
    }
  }
  return local_1;
}

Assistant:

TestCaseProperties parseSpecialTag( StringRef tag ) {
            if( !tag.empty() && tag[0] == '.' )
                return TestCaseProperties::IsHidden;
            else if( tag == "!throws"_sr )
                return TestCaseProperties::Throws;
            else if( tag == "!shouldfail"_sr )
                return TestCaseProperties::ShouldFail;
            else if( tag == "!mayfail"_sr )
                return TestCaseProperties::MayFail;
            else if( tag == "!nonportable"_sr )
                return TestCaseProperties::NonPortable;
            else if( tag == "!benchmark"_sr )
                return TestCaseProperties::Benchmark | TestCaseProperties::IsHidden;
            else
                return TestCaseProperties::None;
        }